

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPlaceholderExpander.cxx
# Opt level: O2

string * __thiscall cmPlaceholderExpander::ExpandVariables(cmPlaceholderExpander *this,string *s)

{
  pointer pcVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  char cVar5;
  string expandedInput;
  string var;
  string replace;
  string local_50 [32];
  
  cVar5 = (char)s;
  uVar3 = std::__cxx11::string::find(cVar5,0x3c);
  if (uVar3 != 0xffffffffffffffff) {
    expandedInput._M_dataplus._M_p = (pointer)&expandedInput.field_2;
    expandedInput._M_string_length = 0;
    expandedInput.field_2._M_local_buf[0] = '\0';
    while ((uVar3 != 0xffffffffffffffff && (uVar3 < s->_M_string_length - 2))) {
      lVar4 = std::__cxx11::string::find(cVar5,0x3e);
      if (lVar4 == -1) {
        std::__cxx11::string::_M_assign((string *)s);
        goto LAB_00477fd4;
      }
      iVar2 = isalpha((int)(s->_M_dataplus)._M_p[uVar3 + 1]);
      if (iVar2 == 0) {
        uVar3 = std::__cxx11::string::find(cVar5,0x3c);
      }
      else {
        std::__cxx11::string::substr((ulong)&var,(ulong)s);
        (*this->_vptr_cmPlaceholderExpander[2])(&replace,this,&var);
        std::__cxx11::string::substr((ulong)local_50,(ulong)s);
        std::__cxx11::string::append((string *)&expandedInput);
        std::__cxx11::string::~string(local_50);
        if ((((uVar3 != 0) && (replace._M_string_length == 0)) &&
            (pcVar1 = (s->_M_dataplus)._M_p, pcVar1[uVar3 - 1] == ' ')) &&
           ((lVar4 + 1U < s->_M_string_length && (pcVar1[lVar4 + 1U] == ' ')))) {
          std::__cxx11::string::pop_back();
        }
        std::__cxx11::string::append((string *)&expandedInput);
        uVar3 = std::__cxx11::string::find(cVar5,0x3c);
        std::__cxx11::string::~string((string *)&replace);
        std::__cxx11::string::~string((string *)&var);
      }
    }
    std::__cxx11::string::substr((ulong)&var,(ulong)s);
    std::__cxx11::string::append((string *)&expandedInput);
    std::__cxx11::string::~string((string *)&var);
    if ((expandedInput._M_string_length != 0) &&
       (expandedInput._M_dataplus._M_p[expandedInput._M_string_length - 1] == ' ')) {
      std::__cxx11::string::pop_back();
    }
    std::__cxx11::string::_M_assign((string *)s);
LAB_00477fd4:
    std::__cxx11::string::~string((string *)&expandedInput);
  }
  return s;
}

Assistant:

std::string& cmPlaceholderExpander::ExpandVariables(std::string& s)
{
  std::string::size_type start = s.find('<');
  // no variables to expand
  if (start == std::string::npos) {
    return s;
  }
  std::string::size_type pos = 0;
  std::string expandedInput;
  while (start != std::string::npos && start < s.size() - 2) {
    std::string::size_type end = s.find('>', start);
    // if we find a < with no > we are done
    if (end == std::string::npos) {
      s = expandedInput;
      return s;
    }
    char c = s[start + 1];
    // if the next char after the < is not A-Za-z then
    // skip it and try to find the next < in the string
    if (!isalpha(c)) {
      start = s.find('<', start + 1);
    } else {
      // extract the var
      std::string var = s.substr(start + 1, end - start - 1);
      std::string replace = this->ExpandVariable(var);
      expandedInput += s.substr(pos, start - pos);

      // Prevent consecutive whitespace in the output if the rule variable
      // expands to an empty string.
      bool consecutive = replace.empty() && start > 0 && s[start - 1] == ' ' &&
        end + 1 < s.size() && s[end + 1] == ' ';
      if (consecutive) {
        expandedInput.pop_back();
      }

      expandedInput += replace;

      // move to next one
      start = s.find('<', start + var.size() + 2);
      pos = end + 1;
    }
  }
  // add the rest of the input
  expandedInput += s.substr(pos, s.size() - pos);
  // remove trailing whitespace
  if (!expandedInput.empty() && expandedInput.back() == ' ') {
    expandedInput.pop_back();
  }
  s = expandedInput;

  return s;
}